

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O3

size_t ZSTD_compress(void *dst,size_t dstCapacity,void *src,size_t srcSize,int compressionLevel)

{
  uint *puVar1;
  long lVar2;
  uint uVar3;
  ZSTD_customMem customMem;
  size_t sVar4;
  ZSTD_CCtx local_408;
  
  puVar1 = (uint *)cpuid_basic_info(0);
  uVar3 = *puVar1;
  memset(&local_408,0,0x3d8);
  local_408.bmi2 = 0;
  if ((uVar3 != 0) && (local_408.bmi2 = 0, 6 < uVar3)) {
    lVar2 = cpuid_Extended_Feature_Enumeration_info(7);
    local_408.bmi2 = *(uint *)(lVar2 + 4) >> 8 & 1;
  }
  local_408.requestedParams.format = ZSTD_f_zstd1;
  local_408.requestedParams.cParams.windowLog = 0;
  local_408.requestedParams.cParams.chainLog = 0;
  local_408.requestedParams.cParams.hashLog = 0;
  local_408.requestedParams.cParams.searchLog = 0;
  local_408.requestedParams.cParams.minMatch = 0;
  local_408.requestedParams.cParams.targetLength = 0;
  local_408.requestedParams.cParams.strategy = 0;
  local_408.requestedParams.forceWindow = 0;
  local_408.requestedParams.attachDictPref = ZSTD_dictDefaultAttach;
  local_408.requestedParams.nbWorkers = 0;
  local_408.requestedParams._60_4_ = 0;
  local_408.requestedParams.jobSize = 0;
  local_408.requestedParams.overlapLog = 0;
  local_408.requestedParams.rsyncable = 0;
  local_408.requestedParams.ldmParams.enableLdm = 0;
  local_408.requestedParams.ldmParams.hashLog = 0;
  local_408.requestedParams.ldmParams.bucketSizeLog = 0;
  local_408.requestedParams.ldmParams.minMatchLength = 0;
  local_408.requestedParams.ldmParams.hashRateLog = 0;
  local_408.requestedParams.ldmParams.windowLog = 0;
  local_408.requestedParams.customMem.customAlloc = (ZSTD_allocFunction)0x0;
  local_408.requestedParams.customMem.customFree = (ZSTD_freeFunction)0x0;
  local_408.requestedParams.customMem.opaque = (void *)0x0;
  local_408.requestedParams.fParams.noDictIDFlag = 0;
  local_408.requestedParams.compressionLevel = 3;
  local_408.requestedParams.fParams.contentSizeFlag = 1;
  local_408.requestedParams.fParams.checksumFlag = 0;
  sVar4 = ZSTD_compress_usingDict
                    (&local_408,dst,dstCapacity,src,srcSize,(void *)0x0,0,compressionLevel);
  customMem.customFree._0_4_ = (int)local_408.customMem.customFree;
  customMem.customAlloc = local_408.customMem.customAlloc;
  customMem.customFree._4_4_ = (int)((ulong)local_408.customMem.customFree >> 0x20);
  customMem.opaque = local_408.customMem.opaque;
  ZSTD_free(local_408.workSpace,customMem);
  local_408.workSpace = (void *)0x0;
  ZSTD_freeCDict(local_408.cdictLocal);
  return sVar4;
}

Assistant:

size_t ZSTD_compress(void* dst, size_t dstCapacity,
               const void* src, size_t srcSize,
                     int compressionLevel)
{
    size_t result;
    ZSTD_CCtx ctxBody;
    ZSTD_initCCtx(&ctxBody, ZSTD_defaultCMem);
    result = ZSTD_compressCCtx(&ctxBody, dst, dstCapacity, src, srcSize, compressionLevel);
    ZSTD_freeCCtxContent(&ctxBody);   /* can't free ctxBody itself, as it's on stack; free only heap content */
    return result;
}